

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O2

void Eso_ManComputeOne(Eso_Man_t *p,Vec_Int_t *vEsop1,Vec_Int_t *vEsop2,Vec_Int_t *vEsop)

{
  int iVar1;
  int iVar2;
  int i;
  int Cube;
  Vec_Int_t *pVVar3;
  int i_00;
  Vec_Int_t vCube2;
  Vec_Int_t vCube1;
  Vec_Int_t local_58;
  Vec_Int_t local_48;
  
  vEsop->nSize = 0;
  if ((vEsop1->nSize == 0) || (vEsop2->nSize == 0)) {
    return;
  }
  i_00 = 0;
  Vec_IntEntry(vEsop1,0);
  Vec_IntEntry(vEsop2,0);
  do {
    if (vEsop1->nSize <= i_00) {
      Eso_ManMinimizeCopy(p,vEsop);
      return;
    }
    iVar1 = Vec_IntEntry(vEsop1,i_00);
    if (iVar1 == p->Cube1) {
      for (iVar1 = 0; iVar1 < vEsop2->nSize; iVar1 = iVar1 + 1) {
        iVar2 = Vec_IntEntry(vEsop2,iVar1);
        Eso_ManMinimizeAdd(p,iVar2);
      }
    }
    else {
      for (iVar2 = 0; iVar2 < vEsop2->nSize; iVar2 = iVar2 + 1) {
        i = Vec_IntEntry(vEsop2,iVar2);
        Cube = iVar1;
        if (i == p->Cube1) {
LAB_005a850d:
          Eso_ManMinimizeAdd(p,Cube);
        }
        else {
          pVVar3 = Hsh_VecReadEntry(p->pHash,iVar1);
          local_48.nCap = pVVar3->nCap;
          local_48.nSize = pVVar3->nSize;
          local_48.pArray = pVVar3->pArray;
          pVVar3 = Hsh_VecReadEntry(p->pHash,i);
          local_58.nCap = pVVar3->nCap;
          local_58.nSize = pVVar3->nSize;
          local_58.pArray = pVVar3->pArray;
          Cube = Eso_ManComputeAnd(p,&local_48,&local_58,p->vCube);
          if (-1 < Cube) goto LAB_005a850d;
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void Eso_ManComputeOne( Eso_Man_t * p, Vec_Int_t * vEsop1, Vec_Int_t * vEsop2, Vec_Int_t * vEsop )
{
    Vec_Int_t vCube1, vCube2;
    int i, k, Cube1, Cube2, Cube;
    Vec_IntClear( vEsop );
    if ( Vec_IntSize(vEsop1) == 0 || Vec_IntSize(vEsop2) == 0 )
        return;
    Cube1 = Vec_IntEntry(vEsop1, 0);
    Cube2 = Vec_IntEntry(vEsop2, 0);
    Vec_IntForEachEntry( vEsop1, Cube1, i )
    {
        if ( Cube1 == p->Cube1 )
        {
            Vec_IntForEachEntry( vEsop2, Cube2, k )
                Eso_ManMinimizeAdd( p, Cube2 );
            continue;
        }
        Vec_IntForEachEntry( vEsop2, Cube2, k )
        {
            if ( Cube2 == p->Cube1 )
            {
                Eso_ManMinimizeAdd( p, Cube1 );
                continue;
            }
            vCube1 = *Hsh_VecReadEntry( p->pHash, Cube1 );
            vCube2 = *Hsh_VecReadEntry( p->pHash, Cube2 );
            Cube = Eso_ManComputeAnd( p, &vCube1, &vCube2, p->vCube );
            if ( Cube >= 0 )
                Eso_ManMinimizeAdd( p, Cube );
        }
    }
    Eso_ManMinimizeCopy( p, vEsop );
}